

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O1

Instr * __thiscall IR::Instr::GetNextByteCodeInstr(Instr *this)

{
  OpCode OVar1;
  code *pcVar2;
  bool bVar3;
  uint32 uVar4;
  uint32 uVar5;
  Instr *this_00;
  undefined4 *puVar6;
  BranchInstr *branchInstr_1;
  BranchInstr *branchInstr;
  
  this_00 = GetNextRealInstrOrLabel(this);
  uVar4 = GetByteCodeOffset(this);
  puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  while ((uVar5 = GetByteCodeOffset(this_00), uVar5 == 0xffffffff ||
         (uVar5 = GetByteCodeOffset(this_00), uVar5 == uVar4))) {
    if (this_00->m_kind == InstrKindBranch) {
      OVar1 = this_00->m_opcode;
      if (OVar1 < ADD) {
        bVar3 = OVar1 == MultiBr || OVar1 == Br;
      }
      else {
        bVar3 = LowererMD::IsUnconditionalBranch(this_00);
      }
      if (bVar3 == false) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar6 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                           ,0xb0c,"(branchInstr->IsUnconditional())",
                           "We can\'t know which branch to take on a conditionnal branch");
        if (!bVar3) goto LAB_004bfd93;
        *puVar6 = 0;
      }
      OVar1 = this_00->m_opcode;
      if (OVar1 < ADD) {
        bVar3 = OVar1 == MultiBr || OVar1 == Br;
      }
      else {
        bVar3 = LowererMD::IsUnconditionalBranch(this_00);
      }
      if (bVar3 == false) goto LAB_004bfc0b;
      this_00 = this_00[1].m_next;
    }
    else {
LAB_004bfc0b:
      this_00 = GetNextRealInstrOrLabel(this_00);
    }
  }
  if (uVar4 != 0xffffffff) {
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    do {
      while( true ) {
        uVar5 = GetByteCodeOffset(this_00);
        if ((uVar5 != 0xffffffff) && (uVar5 = GetByteCodeOffset(this_00), uVar4 <= uVar5)) {
          return this_00;
        }
        if (this_00->m_kind == InstrKindBranch) break;
LAB_004bfd10:
        this_00 = GetNextRealInstrOrLabel(this_00);
      }
      OVar1 = this_00->m_opcode;
      if (OVar1 < ADD) {
        bVar3 = OVar1 == MultiBr || OVar1 == Br;
      }
      else {
        bVar3 = LowererMD::IsUnconditionalBranch(this_00);
      }
      if (bVar3 == false) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar6 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                           ,0xb0c,"(branchInstr->IsUnconditional())",
                           "We can\'t know which branch to take on a conditionnal branch");
        if (!bVar3) goto LAB_004bfd93;
        *puVar6 = 0;
      }
      OVar1 = this_00->m_opcode;
      if (OVar1 < ADD) {
        bVar3 = OVar1 == MultiBr || OVar1 == Br;
      }
      else {
        bVar3 = LowererMD::IsUnconditionalBranch(this_00);
      }
      if (bVar3 == false) goto LAB_004bfd10;
      this_00 = this_00[1].m_next;
    } while( true );
  }
  uVar4 = GetByteCodeOffset(this_00);
  if (uVar4 != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                       ,0xb27,"(nextInstr->GetByteCodeOffset() == 0)",
                       "Only instrs before the first one are allowed to not have a bytecode offset")
    ;
    if (!bVar3) {
LAB_004bfd93:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
  return this_00;
}

Assistant:

IR::Instr *
Instr::GetNextByteCodeInstr() const
{
    IR::Instr * nextInstr = GetNextRealInstrOrLabel();
    uint32 currentOffset = GetByteCodeOffset();
    const auto getNext = [](IR::Instr* nextInstr) -> IR::Instr*
    {
        if (nextInstr->IsBranchInstr())
        {
            IR::BranchInstr* branchInstr = nextInstr->AsBranchInstr();
            AssertMsg(branchInstr->IsUnconditional(), "We can't know which branch to take on a conditionnal branch");
            if (branchInstr->IsUnconditional())
            {
                return branchInstr->GetTarget();
            }
        }
        return nextInstr->GetNextRealInstrOrLabel();
    };
    while (nextInstr->GetByteCodeOffset() == Js::Constants::NoByteCodeOffset ||
        nextInstr->GetByteCodeOffset() == currentOffset)
    {
        nextInstr = getNext(nextInstr);
    }

    // Do not check if the instr trying to bailout is in the function prologue
    // nextInstr->GetByteCodeOffset() < currentOffset would always be true and we would crash
    if (currentOffset != Js::Constants::NoByteCodeOffset)
    {
        // This can happen due to break block removal
        while (nextInstr->GetByteCodeOffset() == Js::Constants::NoByteCodeOffset ||
            nextInstr->GetByteCodeOffset() < currentOffset)
        {
            nextInstr = getNext(nextInstr);
        }
    }
    else
    {
        AssertMsg(nextInstr->GetByteCodeOffset() == 0, "Only instrs before the first one are allowed to not have a bytecode offset");
    }
    return nextInstr;
}